

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3PagerSync(Pager *pPager,char *zSuper)

{
  int iVar1;
  sqlite3_file *in_RSI;
  long in_RDI;
  void *pArg;
  int rc;
  undefined4 in_stack_ffffffffffffffd8;
  int in_stack_ffffffffffffffdc;
  uint in_stack_ffffffffffffffe8;
  
  iVar1 = sqlite3OsFileControl
                    ((sqlite3_file *)(ulong)in_stack_ffffffffffffffe8,(int)((ulong)in_RSI >> 0x20),
                     (void *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8));
  if (iVar1 == 0xc) {
    iVar1 = 0;
  }
  if ((iVar1 == 0) && (*(char *)(in_RDI + 0xb) == '\0')) {
    iVar1 = sqlite3OsSync(in_RSI,in_stack_ffffffffffffffdc);
  }
  return iVar1;
}

Assistant:

SQLITE_PRIVATE int sqlite3PagerSync(Pager *pPager, const char *zSuper){
  int rc = SQLITE_OK;
  void *pArg = (void*)zSuper;
  rc = sqlite3OsFileControl(pPager->fd, SQLITE_FCNTL_SYNC, pArg);
  if( rc==SQLITE_NOTFOUND ) rc = SQLITE_OK;
  if( rc==SQLITE_OK && !pPager->noSync ){
    assert( !MEMDB );
    rc = sqlite3OsSync(pPager->fd, pPager->syncFlags);
  }
  return rc;
}